

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGLDriver::draw3DLine
          (COpenGLDriver *this,vector3df *start,vector3df *end,SColor color)

{
  float fVar1;
  float fVar2;
  SColor *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  setRenderStates3DMode(this);
  this->Quad2DVertices[0].Color.color = color.color;
  this->Quad2DVertices[1].Color.color = color.color;
  fVar1 = start->Z;
  fVar2 = start->Y;
  this->Quad2DVertices[0].Pos.X = start->X;
  this->Quad2DVertices[0].Pos.Y = fVar2;
  this->Quad2DVertices[0].Pos.Z = fVar1;
  fVar1 = end->Z;
  fVar2 = end->Y;
  this->Quad2DVertices[1].Pos.X = end->X;
  this->Quad2DVertices[1].Pos.Y = fVar2;
  this->Quad2DVertices[1].Pos.Z = fVar1;
  if ((this->field_0x583 == '\0') && (this->field_0x5f9 == '\0')) {
    getColorBuffer(this,this->Quad2DVertices,2,EVT_STANDARD);
  }
  COpenGLCacheHandler::setClientState(this->CacheHandler,true,false,true,false);
  glVertexPointer(3,0x1406,0x24,this->Quad2DVertices);
  uVar5 = 4;
  if ((this->field_0x5f9 & 1) != 0) {
    uVar5 = 0x80e1;
  }
  if (((this->field_0x5f9 | this->field_0x583) & 1) == 0) {
    pSVar3 = (SColor *)
             (this->ColorBuffer).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
  }
  else {
    pSVar3 = &this->Quad2DVertices[0].Color;
    if (this->field_0x583 != 0) {
      uVar5 = 0x80e1;
    }
    uVar4 = 0x24;
  }
  glColorPointer(uVar5,0x1401,uVar4,pSVar3);
  glDrawElements(1,2,0x1403,&Quad2DIndices);
  return;
}

Assistant:

void COpenGLDriver::draw3DLine(const core::vector3df &start,
		const core::vector3df &end, SColor color)
{
	setRenderStates3DMode();

	Quad2DVertices[0].Color = color;
	Quad2DVertices[1].Color = color;

	Quad2DVertices[0].Pos = core::vector3df((f32)start.X, (f32)start.Y, (f32)start.Z);
	Quad2DVertices[1].Pos = core::vector3df((f32)end.X, (f32)end.Y, (f32)end.Z);

	if (!FeatureAvailable[IRR_ARB_vertex_array_bgra] && !FeatureAvailable[IRR_EXT_vertex_array_bgra])
		getColorBuffer(Quad2DVertices, 2, EVT_STANDARD);

	CacheHandler->setClientState(true, false, true, false);

	glVertexPointer(3, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(Quad2DVertices))[0].Pos);

#ifdef GL_BGRA
	const GLint colorSize = (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra]) ? GL_BGRA : 4;
#else
	const GLint colorSize = 4;
#endif
	if (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra])
		glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(Quad2DVertices))[0].Color);
	else {
		_IRR_DEBUG_BREAK_IF(ColorBuffer.size() == 0);
		glColorPointer(colorSize, GL_UNSIGNED_BYTE, 0, &ColorBuffer[0]);
	}

	glDrawElements(GL_LINES, 2, GL_UNSIGNED_SHORT, Quad2DIndices);
}